

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemTools::GetCurrentDateTime_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,char *format)

{
  tm *__tp;
  size_t sVar1;
  time_t t;
  char buf [1024];
  time_t local_420;
  char local_418 [1024];
  
  time(&local_420);
  __tp = localtime(&local_420);
  strftime(local_418,0x400,(char *)this,__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_418,local_418 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::GetCurrentDateTime(const char* format)
{
  char buf[1024];
  time_t t;
  time(&t);
  strftime(buf, sizeof(buf), format, localtime(&t));
  return kwsys_stl::string(buf);
}